

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O1

void listCombination(int n,int t)

{
  bool bVar1;
  uint uVar2;
  Vec_Int_t *p;
  int *piVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < t + 2U) {
    iVar7 = t + 3;
  }
  p->nSize = 0;
  p->nCap = iVar7;
  if (iVar7 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar7 << 2);
  }
  p->pArray = piVar3;
  if (-1 < t) {
    iVar7 = -1;
    do {
      Vec_IntPush(p,iVar7);
      iVar7 = iVar7 + 1;
    } while (t != iVar7);
  }
  Vec_IntPush(p,n);
  Vec_IntPush(p,0);
  uVar5 = 0;
  while( true ) {
    uVar5 = uVar5 + 1;
    printf("Comb-%3d : ",(ulong)uVar5);
    if (0 < t) {
      iVar7 = p->nSize;
      uVar6 = (ulong)(uint)t;
      do {
        if (iVar7 <= t) goto LAB_0062eb5d;
        printf("vC[%d] = %d ",uVar6 & 0xffffffff,(ulong)(uint)p->pArray[uVar6]);
        bVar1 = 1 < (long)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar1);
    }
    putchar(10);
    if ((p->nSize < 2) || (uVar2 = p->nSize - 1, uVar2 == 1)) break;
    piVar3 = p->pArray;
    lVar4 = 0;
    while( true ) {
      if (piVar3[lVar4 + 1] + 1 != piVar3[lVar4 + 2]) break;
      piVar3[lVar4 + 1] = (int)lVar4;
      lVar4 = lVar4 + 1;
      if ((ulong)uVar2 - 1 == lVar4) goto LAB_0062eb5d;
    }
    if (t < (int)lVar4 + 1) {
      if (piVar3 != (int *)0x0) {
        free(piVar3);
        p->pArray = (int *)0x0;
      }
      free(p);
      return;
    }
    piVar3[lVar4 + 1] = piVar3[lVar4 + 1] + 1;
  }
LAB_0062eb5d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void listCombination(int n, int t)
{
    Vec_Int_t *vC;
    int i, j, combCounter = 0;

    //Initialization
    vC = Vec_IntAlloc(t+3);
    for(i=-1; i<t; i++)
        Vec_IntPush( vC, i );
    Vec_IntPush( vC, n );
    Vec_IntPush( vC, 0 );

    while(1)
    {
        //visit combination
        printf("Comb-%3d : ", ++combCounter);
        for( i=t; i>0; i--)
            printf("vC[%d] = %d ", i, Vec_IntEntry(vC, i));
        printf("\n");

        j = 1;
        while( Vec_IntEntry( vC, j ) + 1 == Vec_IntEntry( vC, j+1 ) )
        {
            //printf("\nGochon = %d, %d\n", Vec_IntEntry( vC, j ) + 1, Vec_IntEntry( vC, j+1 ));
            Vec_IntWriteEntry( vC, j, j-1 );
            j = j + 1;
        }
        if( j > t ) break;
        Vec_IntWriteEntry( vC, j, Vec_IntEntry( vC, j ) + 1 );
    }
    
    Vec_IntFree(vC);    
}